

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

void * xmalloc(size_t size)

{
  void *pvVar1;
  size_t __size;
  
  __size = size + (size == 0);
  pvVar1 = malloc(__size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  fprintf(_stderr,"Out of memory - unable to allocate %lu bytes",__size);
  abort();
}

Assistant:

void *xmalloc(size_t size)
{
	if (size == 0) {
		size = 1;
	}
	void *result = malloc(size);
	if (result == NULL) {
		fprintf(stderr, "Out of memory - unable to allocate %lu bytes", size);
		abort();
	}
	return result;
}